

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

int PAL_rand(void)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = rand();
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1 % 0x8000;
    }
  }
  abort();
}

Assistant:

int
__cdecl
PAL_rand(void)
{
    int ret;
    PERF_ENTRY(rand);
    ENTRY("rand(void)\n");

    ret = (rand() % (PAL_RAND_MAX + 1));

    LOGEXIT("rand() returning %d\n", ret);
    PERF_EXIT(rand);
    return ret;
}